

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Expression * __thiscall
wasm::
ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
::findBreakTarget(ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
                  *this,Name name)

{
  Expression *this_00;
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Block *pBVar4;
  Loop *pLVar5;
  bool local_51;
  Loop *loop;
  Block *block;
  Expression *curr;
  Index i;
  ControlFlowWalker<wasm::(anonymous_namespace)::Unsubtyping,_wasm::SubtypingDiscoverer<wasm::(anonymous_namespace)::Unsubtyping>_>
  *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  bVar1 = SmallVector<wasm::Expression_*,_10UL>::empty(&this->controlFlowStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!controlFlowStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x180,
                  "Expression *wasm::ControlFlowWalker<wasm::(anonymous namespace)::Unsubtyping, wasm::SubtypingDiscoverer<wasm::(anonymous namespace)::Unsubtyping>>::findBreakTarget(Name) [SubType = wasm::(anonymous namespace)::Unsubtyping, VisitorType = wasm::SubtypingDiscoverer<wasm::(anonymous namespace)::Unsubtyping>]"
                 );
  }
  sVar2 = SmallVector<wasm::Expression_*,_10UL>::size(&this->controlFlowStack);
  curr._4_4_ = (uint)sVar2;
  do {
    curr._4_4_ = curr._4_4_ - 1;
    ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                        (&this->controlFlowStack,(ulong)curr._4_4_);
    this_00 = *ppEVar3;
    pBVar4 = Expression::dynCast<wasm::Block>(this_00);
    if (pBVar4 == (Block *)0x0) {
      pLVar5 = Expression::dynCast<wasm::Loop>(this_00);
      if (pLVar5 == (Loop *)0x0) {
        bVar1 = Expression::is<wasm::If>(this_00);
        local_51 = true;
        if (!bVar1) {
          bVar1 = Expression::is<wasm::Try>(this_00);
          local_51 = true;
          if (!bVar1) {
            local_51 = Expression::is<wasm::TryTable>(this_00);
          }
        }
        if (local_51 == false) {
          __assert_fail("curr->template is<If>() || curr->template is<Try>() || curr->template is<TryTable>()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,399,
                        "Expression *wasm::ControlFlowWalker<wasm::(anonymous namespace)::Unsubtyping, wasm::SubtypingDiscoverer<wasm::(anonymous namespace)::Unsubtyping>>::findBreakTarget(Name) [SubType = wasm::(anonymous namespace)::Unsubtyping, VisitorType = wasm::SubtypingDiscoverer<wasm::(anonymous namespace)::Unsubtyping>]"
                       );
        }
      }
      else {
        bVar1 = IString::operator==((IString *)&this_local,&(pLVar5->name).super_IString);
        if (bVar1) {
          return this_00;
        }
      }
    }
    else {
      bVar1 = IString::operator==((IString *)&this_local,&(pBVar4->name).super_IString);
      if (bVar1) {
        return this_00;
      }
    }
    if (curr._4_4_ == 0) {
      return (Expression *)0x0;
    }
  } while( true );
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!controlFlowStack.empty());
    Index i = controlFlowStack.size() - 1;
    while (true) {
      auto* curr = controlFlowStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      } else {
        // an if, try, or try_table, ignorable
        assert(curr->template is<If>() || curr->template is<Try>() ||
               curr->template is<TryTable>());
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }